

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,SchnorrPubkey *pubkey,
          string *bech32_hrp)

{
  ulong uVar1;
  NetType_conflict local_64;
  CfdSourceLocation local_58;
  allocator local_29;
  string *local_28;
  string *bech32_hrp_local;
  SchnorrPubkey *pubkey_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  local_28 = bech32_hrp;
  bech32_hrp_local = (string *)pubkey;
  pubkey_local._0_4_ = witness_ver;
  pubkey_local._4_4_ = type;
  _witness_ver_local = this;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_64 = kCfdConnectionError;
  }
  else {
    local_64 = pubkey_local._4_4_;
  }
  this->type_ = local_64;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = (WitnessVersion)pubkey_local;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_,(SchnorrPubkey *)bech32_hrp_local);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateTaproot(this,local_28);
  local_58.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_58.filename = local_58.filename + 1;
  local_58.line = 0x22b;
  local_58.funcname = "Address";
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            (&local_58,"call Address({},{},{})",&this->type_,&this->addr_type_,local_28);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey,
    const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(pubkey),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateTaproot(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_, bech32_hrp);
}